

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::min(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  bool bVar1;
  BasicType BVar2;
  uint uVar3;
  float *pfVar4;
  double *pdVar5;
  double local_f8;
  float local_dc;
  Literal local_a8;
  Literal local_90;
  double local_78;
  double r_1;
  double l_1;
  Literal local_40;
  float local_28;
  float local_24;
  float r;
  float l;
  Literal *other_local;
  Literal *this_local;
  
  _r = other;
  other_local = this;
  this_local = __return_storage_ptr__;
  BVar2 = wasm::Type::getBasic(&this->type);
  if (BVar2 == f32) {
    local_24 = getf32(this);
    local_28 = getf32(_r);
    uVar3 = std::isnan((double)(ulong)(uint)local_24);
    if ((uVar3 & 1) == 0) {
      uVar3 = std::isnan((double)(ulong)(uint)local_28);
      if ((uVar3 & 1) == 0) {
        if (((local_24 != local_28) || (local_24 != 0.0)) || (NAN(local_24))) {
          pfVar4 = std::min<float>(&local_24,&local_28);
          Literal(__return_storage_ptr__,*pfVar4);
        }
        else {
          bVar1 = std::signbit(local_24);
          if (bVar1) {
            local_dc = local_24;
          }
          else {
            local_dc = local_28;
          }
          Literal(__return_storage_ptr__,local_dc);
        }
      }
      else {
        Literal((Literal *)&l_1,local_28);
        standardizeNaN(__return_storage_ptr__,(Literal *)&l_1);
        ~Literal((Literal *)&l_1);
      }
    }
    else {
      Literal(&local_40,local_24);
      standardizeNaN(__return_storage_ptr__,&local_40);
      ~Literal(&local_40);
    }
  }
  else {
    if (BVar2 != f64) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x5e2);
    }
    r_1 = getf64(this);
    local_78 = getf64(_r);
    uVar3 = std::isnan(r_1);
    if ((uVar3 & 1) == 0) {
      uVar3 = std::isnan(local_78);
      if ((uVar3 & 1) == 0) {
        if (((r_1 != local_78) || (r_1 != 0.0)) || (NAN(r_1))) {
          pdVar5 = std::min<double>(&r_1,&local_78);
          Literal(__return_storage_ptr__,*pdVar5);
        }
        else {
          bVar1 = std::signbit(r_1);
          if (bVar1) {
            local_f8 = r_1;
          }
          else {
            local_f8 = local_78;
          }
          Literal(__return_storage_ptr__,local_f8);
        }
      }
      else {
        Literal(&local_a8,local_78);
        standardizeNaN(__return_storage_ptr__,&local_a8);
        ~Literal(&local_a8);
      }
    }
    else {
      Literal(&local_90,r_1);
      standardizeNaN(__return_storage_ptr__,&local_90);
      ~Literal(&local_90);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::min(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::f32: {
      auto l = getf32(), r = other.getf32();
      if (std::isnan(l)) {
        return standardizeNaN(Literal(l));
      }
      if (std::isnan(r)) {
        return standardizeNaN(Literal(r));
      }
      if (l == r && l == 0) {
        return Literal(std::signbit(l) ? l : r);
      }
      return Literal(std::min(l, r));
    }
    case Type::f64: {
      auto l = getf64(), r = other.getf64();
      if (std::isnan(l)) {
        return standardizeNaN(Literal(l));
      }
      if (std::isnan(r)) {
        return standardizeNaN(Literal(r));
      }
      if (l == r && l == 0) {
        return Literal(std::signbit(l) ? l : r);
      }
      return Literal(std::min(l, r));
    }
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}